

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
* anon_unknown.dwarf_474c66::ArchToolsetHelper
            (function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*)>
             *__return_storage_ptr__,offset_in_ConfigurePreset_to_string valueField,
            offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
            strategyField)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  anon_class_56_3_46d84aa4 local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [2];
  basic_string_view<char,_std::char_traits<char>_> local_88;
  ReadFileResult local_78 [2];
  Object<cmCMakePresetsGraph::ConfigurePreset> local_70;
  undefined1 local_48 [8];
  Object<cmCMakePresetsGraph::ConfigurePreset> objectHelper;
  offset_in_ConfigurePreset_to_optional<cmCMakePresetsGraph::ArchToolsetStrategy>
  strategyField_local;
  offset_in_ConfigurePreset_to_string valueField_local;
  
  local_78[1] = 0;
  local_78[0] = INVALID_PRESET;
  objectHelper._32_8_ = strategyField;
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object(&local_70,local_78 + 1,local_78,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"value");
  pOVar1 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::__cxx11::string,cmCMakePresetsGraph::ReadFileResult(*)(std::__cxx11::string&,Json::Value_const*)>
                     (&local_70,&local_88,valueField,cmCMakePresetsGraphInternal::PresetStringHelper
                      ,false);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_a8,"strategy");
  pOVar1 = cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
           Object<cmCMakePresetsGraph::ConfigurePreset>::
           Bind<cmCMakePresetsGraph::ConfigurePreset,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>,cmCMakePresetsGraph::ReadFileResult(*)(std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>&,Json::Value_const*)>
                     (pOVar1,local_a8,objectHelper._32_8_,ArchToolsetStrategyHelper,false);
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_48,pOVar1);
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::~Object(&local_70);
  local_e0.strategyField._0_4_ = objectHelper.Fail;
  local_e0.strategyField._4_1_ = objectHelper.AllowExtra;
  local_e0.strategyField._5_3_ = objectHelper._37_3_;
  local_e0.valueField = valueField;
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::Object
            (&local_e0.objectHelper,(Object<cmCMakePresetsGraph::ConfigurePreset> *)local_48);
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*)>
  ::
  function<(anonymous_namespace)::ArchToolsetHelper(std::__cxx11::string_cmCMakePresetsGraph::ConfigurePreset::*,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>cmCMakePresetsGraph::ConfigurePreset::*)::__0,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*)>
              *)__return_storage_ptr__,&local_e0);
  (anonymous_namespace)::
  ArchToolsetHelper(std::__cxx11::string_cmCMakePresetsGraph::ConfigurePreset::*,std::optional<cmCMakePresetsGraph::ArchToolsetStrategy>cmCMakePresetsGraph::ConfigurePreset::*)
  ::$_0::~__0((__0 *)&local_e0);
  cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
  Object<cmCMakePresetsGraph::ConfigurePreset>::~Object
            ((Object<cmCMakePresetsGraph::ConfigurePreset> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::function<ReadFileResult(ConfigurePreset&, const Json::Value*)>
ArchToolsetHelper(
  std::string ConfigurePreset::*valueField,
  cm::optional<ArchToolsetStrategy> ConfigurePreset::*strategyField)
{
  auto const objectHelper =
    JSONHelperBuilder::Object<ConfigurePreset>(
      ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESET, false)
      .Bind("value", valueField,
            cmCMakePresetsGraphInternal::PresetStringHelper, false)
      .Bind("strategy", strategyField, ArchToolsetStrategyHelper, false);
  return [valueField, strategyField, objectHelper](
           ConfigurePreset& out, const Json::Value* value) -> ReadFileResult {
    if (!value) {
      (out.*valueField).clear();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isString()) {
      out.*valueField = value->asString();
      out.*strategyField = cm::nullopt;
      return ReadFileResult::READ_OK;
    }

    if (value->isObject()) {
      return objectHelper(out, value);
    }

    return ReadFileResult::INVALID_PRESET;
  };
}